

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMux.c
# Opt level: O2

int Lpk_MapTreeBestCofVar(Lpk_Man_t *p,uint *pTruth,int nVars,uint *pCof0,uint *pCof1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar;
  int iVar_00;
  int iVar7;
  
  iVar_00 = 0;
  iVar4 = 0;
  if (0 < nVars) {
    iVar4 = nVars;
  }
  iVar7 = 100000000;
  iVar = -1;
  for (; iVar4 != iVar_00; iVar_00 = iVar_00 + 1) {
    Kit_TruthCofactor0New(pCof0,pTruth,nVars,iVar_00);
    Kit_TruthCofactor1New(pCof1,pTruth,nVars,iVar_00);
    iVar5 = Kit_TruthSupportSize(pCof0,nVars);
    iVar6 = Kit_TruthSupportSize(pCof1,nVars);
    iVar1 = p->pPars->nLutSize;
    iVar3 = iVar6 + iVar5;
    iVar2 = iVar_00;
    if ((iVar1 < iVar6 || iVar1 < iVar5) || iVar7 <= iVar6 + iVar5) {
      iVar3 = iVar7;
      iVar2 = iVar;
    }
    iVar7 = iVar3;
    iVar = iVar2;
  }
  if (iVar != -1) {
    Kit_TruthCofactor0New(pCof0,pTruth,nVars,iVar);
    Kit_TruthCofactor1New(pCof1,pTruth,nVars,iVar);
  }
  return iVar;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the best cofactoring variable.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Lpk_MapTreeBestCofVar( Lpk_Man_t * p, unsigned * pTruth, int nVars, unsigned * pCof0, unsigned * pCof1 )
{
    int i, iBestVar, nSuppSizeCur0, nSuppSizeCur1, nSuppSizeCur, nSuppSizeMin;
    // iterate through variables
    iBestVar = -1;
    nSuppSizeMin = KIT_INFINITY;
    for ( i = 0; i < nVars; i++ )
    {
        // cofactor the functiona and get support sizes
        Kit_TruthCofactor0New( pCof0, pTruth, nVars, i );
        Kit_TruthCofactor1New( pCof1, pTruth, nVars, i );
        nSuppSizeCur0 = Kit_TruthSupportSize( pCof0, nVars );
        nSuppSizeCur1 = Kit_TruthSupportSize( pCof1, nVars );
        nSuppSizeCur  = nSuppSizeCur0 + nSuppSizeCur1;
        // skip cofactoring that goes above the limit
        if ( nSuppSizeCur0 > p->pPars->nLutSize || nSuppSizeCur1 > p->pPars->nLutSize )
            continue;
        // compare this variable with other variables
        if ( nSuppSizeMin > nSuppSizeCur ) 
        {
            nSuppSizeMin = nSuppSizeCur;
            iBestVar = i;
        }
    }
    // cofactor w.r.t. this variable
    if ( iBestVar != -1 )
    {
        Kit_TruthCofactor0New( pCof0, pTruth, nVars, iBestVar );
        Kit_TruthCofactor1New( pCof1, pTruth, nVars, iBestVar );
    }
    return iBestVar;
}